

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
fmcalc::assign_coverage_ids
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,fmcalc *this,
          int level,int to_agg_id)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  int *piVar4;
  set<int,_std::less<int>,_std::allocator<int>_> temp_set;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (level == 0) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               __return_storage_ptr__,
               (this->item_to_cov_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + to_agg_id);
  }
  else {
    lVar3 = (long)to_agg_id;
    lVar2 = *(long *)&(this->node_to_direct_sub_nodes_vec_).
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[level].
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    piVar4 = *(int **)(lVar2 + lVar3 * 0x18);
    if (piVar4 != *(int **)(lVar2 + 8 + lVar3 * 0x18)) {
      do {
        assign_coverage_ids((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,this,
                            level + -1,*piVar4);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   __return_storage_ptr__,
                   (_Rb_tree_const_iterator<int>)
                   local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<int>)&local_60._M_impl.super__Rb_tree_header);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_60);
        piVar4 = piVar4 + 1;
      } while (piVar4 != *(int **)(*(long *)&(this->node_to_direct_sub_nodes_vec_).
                                             super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[level].
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data + 8 + lVar3 * 0x18));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               (lVar3 * 0x30 +
               *(long *)&(this->node_to_coverage_ids_).
                         super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[level].
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data),&__return_storage_ptr__->_M_t);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<int> fmcalc::assign_coverage_ids(const int level, const int to_agg_id)
{
	std::set<int> ret_set;
	if (level == 0) {   // Youngest generation
		ret_set.insert(item_to_cov_id_[to_agg_id]);
		return ret_set;
	}

	for (std::vector<int>::iterator agg_id = node_to_direct_sub_nodes_vec_[level][to_agg_id].begin();
			agg_id != node_to_direct_sub_nodes_vec_[level][to_agg_id].end(); agg_id++) {

		std::set<int> temp_set = assign_coverage_ids(level-1, *agg_id);
		ret_set.insert(temp_set.begin(), temp_set.end());

	}

	node_to_coverage_ids_[level][to_agg_id] = ret_set;
	return ret_set;
}